

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

double __thiscall hrgls::StreamProperties::Rate(StreamProperties *this)

{
  element_type *peVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  double ret;
  key_type local_28;
  double local_20;
  
  mVar2 = hrgls_StreamPropertiesGetRate
                    ((((this->m_private).
                       super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_state).
                     super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_20);
  peVar1 = (this->m_private).
           super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_28._M_thread = pthread_self();
  pmVar3 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&peVar1->m_status,&local_28);
  *pmVar3 = mVar2;
  return local_20;
}

Assistant:

double StreamProperties::Rate()
  {
    double ret;
    if (m_private) {
      m_private->m_status[std::this_thread::get_id()] = hrgls_StreamPropertiesGetRate(m_private->m_state.get(), &ret);
    }

    return ret;
  }